

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_dense.c
# Opt level: O0

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  long lVar3;
  double local_68;
  uint local_5c;
  double local_58;
  realtype maxerr;
  realtype *Ydata;
  realtype *Xdata;
  sunindextype local_length;
  sunindextype i;
  int failure;
  realtype tol_local;
  N_Vector Y_local;
  N_Vector X_local;
  
  i._4_4_ = 0;
  prVar1 = N_VGetArrayPointer(X);
  prVar2 = N_VGetArrayPointer(Y);
  lVar3 = N_VGetLength_Serial(X);
  for (local_length = 0; local_length < lVar3; local_length = local_length + 1) {
    if (NAN(prVar1[local_length])) {
      local_5c = 1;
    }
    else {
      local_5c = (uint)(tol < (double)((ulong)(prVar1[local_length] - prVar2[local_length]) &
                                      (ulong)DAT_00105020));
    }
    i._4_4_ = local_5c + i._4_4_;
  }
  if ((double)i._4_4_ <= 0.0) {
    X_local._4_4_ = 0;
  }
  else {
    local_58 = 0.0;
    for (local_length = 0; local_length < lVar3; local_length = local_length + 1) {
      if (ABS(prVar1[local_length] - prVar2[local_length]) <= local_58) {
        local_68 = local_58;
      }
      else {
        local_68 = ABS(prVar1[local_length] - prVar2[local_length]);
      }
      local_58 = local_68;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",local_58,SUB84(tol,0));
    X_local._4_4_ = 1;
  }
  return X_local._4_4_;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i, local_length;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  local_length = N_VGetLength_Serial(X);
  
  /* check vector data */
  for(i=0; i < local_length; i++)
    failure += FNEQ(Xdata[i], Ydata[i], tol);

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < local_length; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, tol);
    return(1);
  }
  else
    return(0);
}